

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header7.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Header7::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Header7 *this)

{
  byte bVar1;
  ostream *poVar2;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString KStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  Header6::GetAsString_abi_cxx11_(&KStack_1c8,&this->super_Header6);
  std::operator<<(local_198,(string *)&KStack_1c8);
  std::__cxx11::string::~string((string *)&KStack_1c8);
  if (0x47 < (this->super_Header6).m_ui8PDUType) goto LAB_001298ae;
  poVar2 = std::operator<<(local_198,"PDU Status:\n");
  poVar2 = std::operator<<(poVar2,"\tCoupled Extension Indicator: ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(byte)(this->super_Header6).field_0x24 >> 3 & 1);
  std::operator<<(poVar2,"\n");
  bVar1 = (this->super_Header6).m_ui8PDUType;
  if (((bVar1 - 0x17 < 0x2d) && ((0x10000004033fU >> ((ulong)(bVar1 - 0x17) & 0x3f) & 1) != 0)) ||
     (bVar1 == 1)) {
    poVar2 = std::operator<<(local_198,"\tTransferred Entity Indicator: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(byte)(this->super_Header6).field_0x24 & 1);
    std::operator<<(poVar2,"\n");
    bVar1 = (this->super_Header6).m_ui8PDUType;
  }
  if (((bVar1 - 0x17 < 0x31) && ((0x1f0000004033fU >> ((ulong)(bVar1 - 0x17) & 0x3f) & 1) != 0)) ||
     (bVar1 - 1 < 2)) {
    poVar2 = std::operator<<(local_198,"\tLVC Indicator: ");
    DATA_TYPE::ENUMS::GetEnumAsStringLVCIndicator_abi_cxx11_
              (&KStack_1c8,(ENUMS *)(ulong)(*(uint *)&(this->super_Header6).field_0x24 >> 1 & 3),
               Value);
    poVar2 = std::operator<<(poVar2,(string *)&KStack_1c8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&KStack_1c8);
    if ((this->super_Header6).m_ui8PDUType != '\x02') goto LAB_001297ae;
    poVar2 = std::operator<<(local_198,"\tDetonation Type Indicator: ");
    bVar1 = 3;
  }
  else {
LAB_001297ae:
    poVar2 = std::operator<<(local_198,"\tFire Type Indicator: ");
    bVar1 = 1;
  }
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(ushort)(bVar1 & (this->super_Header6).field_0x25));
  std::operator<<(poVar2,"\n");
  bVar1 = (this->super_Header6).m_ui8PDUType;
  if (bVar1 - 0x19 < 3) {
    poVar2 = std::operator<<(local_198,"\tRadio Attached Indicator: ");
    DATA_TYPE::ENUMS::GetEnumAsStringAttachedIndicator_abi_cxx11_
              (&KStack_1c8,(ENUMS *)(ulong)((byte)(this->super_Header6).field_0x25 & 3),Value_00);
    poVar2 = std::operator<<(poVar2,(string *)&KStack_1c8);
    std::operator<<(poVar2,"\n");
LAB_0012986e:
    std::__cxx11::string::~string((string *)&KStack_1c8);
    bVar1 = (this->super_Header6).m_ui8PDUType;
  }
  else if (bVar1 - 0x1f < 2) {
    poVar2 = std::operator<<(local_198,"\tIntercom Attached Indicator: ");
    DATA_TYPE::ENUMS::GetEnumAsStringAttachedIndicator_abi_cxx11_
              (&KStack_1c8,(ENUMS *)(ulong)((byte)(this->super_Header6).field_0x25 & 3),Value_01);
    poVar2 = std::operator<<(poVar2,(string *)&KStack_1c8);
    std::operator<<(poVar2,"\n");
    goto LAB_0012986e;
  }
  if (bVar1 == 0x1c) {
    poVar2 = std::operator<<(local_198,"\tSimulation Mode: ");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(byte)(this->super_Header6).field_0x26 >> 1 & 1);
    std::operator<<(poVar2,"\n");
  }
LAB_001298ae:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

KString Header7::GetAsString() const
{
    KStringStream ss;

    ss << Header6::GetAsString();

    // Append the status flags this PDU should have
    if( m_ui8PDUType < Attribute_PDU_Type )
    {
        //
        // CEI - Applies to every PDU except attribute
        //
        ss << "PDU Status:\n"
           << "\tCoupled Extension Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusCEI << "\n";

        //
        // TEI - Applies to various PDU
        //
        if( m_ui8PDUType == Entity_State_PDU_Type               ||
            m_ui8PDUType == Electromagnetic_Emission_PDU_Type   ||
            m_ui8PDUType == Designator_PDU_Type                 ||
            m_ui8PDUType == Transmitter_PDU_Type                ||
            m_ui8PDUType == Signal_PDU_Type                     ||
            m_ui8PDUType == Receiver_PDU_Type                   ||
            m_ui8PDUType == IFF_ATC_NAVAIDS_PDU_Type            ||
            m_ui8PDUType == IntercomSignal_PDU_Type             ||
            m_ui8PDUType == IntercomControl_PDU_Type            ||
            m_ui8PDUType == EnvironmentalProcess_PDU_Type       ||
            m_ui8PDUType == EntityStateUpdate_PDU_Type )
        {
            ss << "\tTransferred Entity Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusTEI << "\n";
        }

        //
        // LVC - Applies to various PDU
        //
        if( m_ui8PDUType == Entity_State_PDU_Type               ||
            m_ui8PDUType == Fire_PDU_Type                       ||
            m_ui8PDUType == Designator_PDU_Type                 ||
            m_ui8PDUType == Electromagnetic_Emission_PDU_Type   ||
            m_ui8PDUType == Transmitter_PDU_Type                ||
            m_ui8PDUType == Signal_PDU_Type                     ||
            m_ui8PDUType == Receiver_PDU_Type                   ||
            m_ui8PDUType == IFF_ATC_NAVAIDS_PDU_Type            ||
            m_ui8PDUType == IntercomSignal_PDU_Type             ||
            m_ui8PDUType == IntercomControl_PDU_Type            ||
            m_ui8PDUType == EnvironmentalProcess_PDU_Type       ||
            m_ui8PDUType == EntityStateUpdate_PDU_Type          ||
            m_ui8PDUType == DirectedEnergyFire_PDU_Type         ||
            m_ui8PDUType == EntityDamageStatus_PDU_Type         ||
            m_ui8PDUType == IO_Action_PDU_Type                  ||
            m_ui8PDUType == IO_Report_PDU_Type )
        {
            ss << "\tLVC Indicator: " << GetEnumAsStringLVCIndicator( m_PDUStatusUnion.m_ui8PDUStatusLVC ) << "\n";
        }

        //
        // FTI - Fire PDU only or DTI - Detonation PDU only
        //
        if( m_ui8PDUType != Fire_PDU_Type )
        {
            ss << "\tFire Type Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusFTI << "\n";
        }
        else if( m_ui8PDUType != Detonation_PDU_Type )
        {
            ss << "\tDetonation Type Indicator: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI << "\n";
        }

        //
        // RAI - Transmitter(25), Signal(26), Receiver(27) or IAI  - IntercomSignal(31), IntercomControl(32)
        //
        if( m_ui8PDUType == Transmitter_PDU_Type  ||
            m_ui8PDUType == Signal_PDU_Type       ||
            m_ui8PDUType == Receiver_PDU_Type )
        {
            ss << "\tRadio Attached Indicator: " << GetEnumAsStringAttachedIndicator( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI ) << "\n";
        }
        else if( m_ui8PDUType == IntercomSignal_PDU_Type  ||
                 m_ui8PDUType == IntercomControl_PDU_Type )
        {
            ss << "\tIntercom Attached Indicator: " << GetEnumAsStringAttachedIndicator( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI ) << "\n";
        }

        //
        // SM - IFF ATC NAVAIDS(28) only
        //
        if( m_ui8PDUType == IFF_ATC_NAVAIDS_PDU_Type )
        {
            ss << "\tSimulation Mode: " << ( KUINT16 )m_PDUStatusUnion.m_ui8PDUStatusSM << "\n";
        }
    }

    return ss.str();
}